

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcDimensionCurveTerminator::IfcDimensionCurveTerminator
          (IfcDimensionCurveTerminator *this)

{
  *(undefined ***)&this->field_0xd8 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0xe0 = 0;
  *(char **)&this->field_0xe8 = "IfcDimensionCurveTerminator";
  IfcTerminatorSymbol::IfcTerminatorSymbol
            (&this->super_IfcTerminatorSymbol,&PTR_construction_vtable_24__007aeab0);
  *(undefined8 *)&(this->super_IfcTerminatorSymbol).field_0xb0 = 0;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem = 0x7ae9a8;
  *(undefined8 *)&this->field_0xd8 = 0x7aea98;
  (this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
  super_IfcAnnotationOccurrence.super_IfcStyledItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x7ae9d0;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x70 = 0x7ae9f8;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.super_IfcStyledItem.field_0x80 = 0x7aea20;
  *(undefined8 *)
   &(this->super_IfcTerminatorSymbol).super_IfcAnnotationSymbolOccurrence.
    super_IfcAnnotationOccurrence.field_0x90 = 0x7aea48;
  *(undefined8 *)&(this->super_IfcTerminatorSymbol).field_0xa8 = 0x7aea70;
  *(undefined1 **)&(this->super_IfcTerminatorSymbol).field_0xb8 = &this->field_0xc8;
  *(undefined8 *)&this->field_0xc0 = 0;
  this->field_0xc8 = 0;
  return;
}

Assistant:

IfcDimensionCurveTerminator() : Object("IfcDimensionCurveTerminator") {}